

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

int Cudd_StdPostReordHook(DdManager *dd,char *str,void *data)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  abctime aVar3;
  ulong uVar4;
  
  aVar3 = Extra_CpuTime();
  __stream = (FILE *)dd->out;
  iVar1 = strcmp(str,"BDD");
  if (iVar1 == 0) {
    uVar4 = Cudd_ReadNodeCount(dd);
  }
  else {
    uVar4 = (ulong)((dd->keysZ - dd->deadZ) + 2);
  }
  iVar1 = fprintf(__stream,"%ld nodes in %g sec\n",(double)(aVar3 - (long)data) / 1000.0,uVar4);
  if (iVar1 == -1) {
    uVar2 = 0;
  }
  else {
    iVar1 = fflush((FILE *)dd->out);
    uVar2 = (uint)(iVar1 != -1);
  }
  return uVar2;
}

Assistant:

int
Cudd_StdPostReordHook(
  DdManager *dd,
  const char *str,
  void *data)
{
    long initialTime = (long) data;
    int retval;
    long finalTime = util_cpu_time();
    double totalTimeSec = (double)(finalTime - initialTime) / 1000.0;

    retval = fprintf(dd->out,"%ld nodes in %g sec\n", strcmp(str, "BDD") == 0 ?
                     Cudd_ReadNodeCount(dd) : Cudd_zddReadNodeCount(dd),
                     totalTimeSec);
    if (retval == EOF) return(0);
    retval = fflush(dd->out);
    if (retval == EOF) return(0);
    return(1);

}